

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

dynamic_string * __thiscall
crnlib::dynamic_string::set_from_buf(dynamic_string *this,void *pBuf,uint buf_size)

{
  ushort uVar1;
  ulong __n;
  
  if (buf_size < 0xffff) {
    uVar1 = this->m_buf_size;
    if (uVar1 <= buf_size) {
      expand_buf(this,buf_size + 1,false);
      uVar1 = this->m_buf_size;
    }
    if (buf_size < uVar1) {
      if (buf_size == 0) {
        __n = 0;
      }
      else {
        __n = (ulong)buf_size;
        memcpy(this->m_pStr,pBuf,__n);
      }
      this->m_pStr[__n] = '\0';
      this->m_len = (uint16)buf_size;
    }
  }
  else {
    clear(this);
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::set_from_buf(const void* pBuf, uint buf_size)
    {
        CRNLIB_ASSERT(pBuf);

        if (buf_size >= cUINT16_MAX)
        {
            clear();
            return *this;
        }

#ifdef CRNLIB_BUILD_DEBUG
        if ((buf_size) && (memchr(pBuf, 0, buf_size) != nullptr))
        {
            CRNLIB_ASSERT(0);
            clear();
            return *this;
        }
#endif

        if (ensure_buf(buf_size, false))
        {
            if (buf_size)
            {
                memcpy(m_pStr, pBuf, buf_size);
            }

            m_pStr[buf_size] = 0;

            m_len = static_cast<uint16>(buf_size);

            check();
        }

        return *this;
    }